

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
ipx::Model::DualizeBackInteriorSolution
          (Model *this,Vector *x_solver,Vector *xl_solver,Vector *xu_solver,Vector *y_solver,
          Vector *zl_solver,Vector *zu_solver,Vector *x_user,Vector *xl_user,Vector *xu_user,
          Vector *slack_user,Vector *y_user,Vector *zl_user,Vector *zu_user)

{
  char cVar1;
  bool bVar2;
  const_reference pvVar3;
  double *pdVar4;
  reference piVar5;
  double dVar6;
  valarray<double> *in_RCX;
  valarray<double> *in_RDX;
  valarray<double> *in_RSI;
  size_t sVar7;
  Model *in_RDI;
  valarray<double> *in_R8;
  valarray<double> *in_R9;
  valarray<double> *in_stack_00000008;
  valarray<double> *in_stack_00000018;
  valarray<double> *in_stack_00000020;
  valarray<double> *in_stack_00000028;
  valarray<double> *in_stack_00000030;
  valarray<double> *in_stack_00000038;
  valarray<double> *in_stack_00000040;
  Int i_4;
  Int i_3;
  Int i_2;
  Int j_2;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  Int i_1;
  Int j_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  Int k;
  Int j;
  Int i;
  Int n;
  Int m;
  valarray<double> *in_stack_fffffffffffffe68;
  valarray<double> *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  Int IVar8;
  undefined8 in_stack_fffffffffffffe90;
  int iVar9;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  Int IVar10;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  valarray<double> *in_stack_fffffffffffffeb0;
  int local_a8;
  int local_a4;
  int local_a0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  vector<int,_std::allocator<int>_> *local_88;
  undefined8 local_80;
  int local_78;
  int local_74;
  int *local_70;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  vector<int,_std::allocator<int>_> *local_60;
  int local_54;
  undefined8 local_50;
  int local_48;
  int local_44;
  _UnClos<std::__negate,_std::_ValArray,_double> local_40;
  Int local_38;
  Int local_34;
  valarray<double> *local_30;
  valarray<double> *local_28;
  valarray<double> *local_20;
  valarray<double> *local_18;
  valarray<double> *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_34 = rows(in_RDI);
  local_38 = cols(in_RDI);
  if ((in_RDI->dualized_ & 1U) == 0) {
    std::begin<double>(in_stack_fffffffffffffe70);
    std::begin<double>(in_stack_fffffffffffffe70);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
               (double *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    for (local_a4 = 0; iVar9 = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20), local_a4 < local_34;
        local_a4 = local_a4 + 1) {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         (&in_RDI->constr_type_,(long)local_a4);
      cVar1 = *pvVar3;
      if (cVar1 == '<') {
        pdVar4 = std::valarray<double>::operator[](local_30,(long)(local_38 + local_a4));
        dVar6 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000030,(long)local_a4);
        *pdVar4 = -dVar6;
      }
      else if (cVar1 == '=') {
        pdVar4 = std::valarray<double>::operator[](local_28,(long)local_a4);
        dVar6 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000030,(long)local_a4);
        *pdVar4 = dVar6;
      }
      else if (cVar1 == '>') {
        pdVar4 = std::valarray<double>::operator[](in_stack_00000008,(long)(local_38 + local_a4));
        dVar6 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000030,(long)local_a4);
        *pdVar4 = dVar6;
      }
    }
    std::begin<double>(in_stack_fffffffffffffe70);
    IVar8 = in_RDI->num_var_;
    std::begin<double>(in_stack_fffffffffffffe70);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),iVar9,
               (double *)CONCAT44(IVar8,in_stack_fffffffffffffe88));
    pdVar4 = std::begin<double>(in_stack_fffffffffffffe70);
    iVar9 = (int)((ulong)pdVar4 >> 0x20);
    IVar10 = in_RDI->num_var_;
    std::begin<double>(in_stack_fffffffffffffe70);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(IVar10,in_stack_fffffffffffffe98),iVar9,
               (double *)CONCAT44(IVar8,in_stack_fffffffffffffe88));
    std::begin<double>(in_stack_fffffffffffffe70);
    std::begin<double>(in_stack_fffffffffffffe70);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(IVar10,in_stack_fffffffffffffe98),iVar9,
               (double *)CONCAT44(IVar8,in_stack_fffffffffffffe88));
    std::begin<double>(in_stack_fffffffffffffe70);
    std::begin<double>(in_stack_fffffffffffffe70);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(IVar10,in_stack_fffffffffffffe98),iVar9,
               (double *)CONCAT44(IVar8,in_stack_fffffffffffffe88));
    for (local_a8 = 0; local_a8 < local_34; local_a8 = local_a8 + 1) {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         (&in_RDI->constr_type_,(long)local_a8);
      cVar1 = *pvVar3;
      if (cVar1 == '<') {
        pdVar4 = std::valarray<double>::operator[](local_18,(long)(local_38 + local_a8));
        dVar6 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000028,(long)local_a8);
        *pdVar4 = dVar6;
      }
      else if (cVar1 == '=') {
        pdVar4 = std::valarray<double>::operator[](in_stack_00000028,(long)local_a8);
        *pdVar4 = 0.0;
      }
      else if (cVar1 == '>') {
        pdVar4 = std::valarray<double>::operator[](local_20,(long)(local_38 + local_a8));
        dVar6 = -*pdVar4;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000028,(long)local_a8);
        *pdVar4 = dVar6;
      }
    }
  }
  else {
    local_40.super__UnBase<std::__negate,_std::valarray<double>_>._M_expr =
         (_UnBase<std::__negate,_std::valarray<double>_>)
         std::valarray<double>::operator-(in_stack_fffffffffffffe68);
    std::valarray<double>::operator=
              (in_stack_fffffffffffffeb0,
               (_Expr<std::__detail::_UnClos<std::__negate,_std::_ValArray,_double>,_double> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    for (local_44 = 0; iVar9 = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
        local_44 < in_RDI->num_constr_; local_44 = local_44 + 1) {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         (&in_RDI->constr_type_,(long)local_44);
      cVar1 = *pvVar3;
      if (cVar1 == '<') {
        pdVar4 = std::valarray<double>::operator[](local_20,(long)local_44);
        dVar6 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000030,(long)local_44);
        *pdVar4 = -dVar6;
      }
      else if (cVar1 == '=') {
        pdVar4 = std::valarray<double>::operator[](local_10,(long)local_44);
        dVar6 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000030,(long)local_44);
        *pdVar4 = dVar6;
      }
      else if (cVar1 == '>') {
        pdVar4 = std::valarray<double>::operator[](local_18,(long)local_44);
        dVar6 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000030,(long)local_44);
        *pdVar4 = dVar6;
      }
    }
    std::begin<double>(in_stack_fffffffffffffe70);
    std::begin<double>(in_stack_fffffffffffffe70);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),iVar9,
               (double *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    for (local_48 = 0; local_48 < in_RDI->num_var_; local_48 = local_48 + 1) {
      pdVar4 = std::valarray<double>::operator[](&in_RDI->scaled_lbuser_,(long)local_48);
      bVar2 = std::isfinite(*pdVar4);
      if (!bVar2) {
        pdVar4 = std::valarray<double>::operator[](in_stack_00000038,(long)local_48);
        *pdVar4 = 0.0;
      }
    }
    local_50 = 0;
    std::valarray<double>::operator=(in_stack_fffffffffffffe70,(double *)in_stack_fffffffffffffe68);
    local_54 = in_RDI->num_constr_;
    local_60 = &in_RDI->boxed_vars_;
    local_68._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
    local_70 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffffe70,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffffe68), bVar2) {
      piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_68);
      local_74 = *piVar5;
      sVar7 = (size_t)local_54;
      local_54 = local_54 + 1;
      pdVar4 = std::valarray<double>::operator[](local_18,sVar7);
      dVar6 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](in_stack_00000040,(long)local_74);
      *pdVar4 = dVar6;
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_68);
    }
    for (local_78 = 0; local_78 < local_34; local_78 = local_78 + 1) {
      pdVar4 = std::valarray<double>::operator[](&in_RDI->scaled_lbuser_,(long)local_78);
      bVar2 = std::isfinite(*pdVar4);
      if (bVar2) {
        pdVar4 = std::valarray<double>::operator[](local_30,(long)(local_38 + local_78));
        dVar6 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000018,(long)local_78);
        *pdVar4 = dVar6;
      }
      else {
        pdVar4 = std::valarray<double>::operator[](in_stack_00000018,(long)local_78);
        *pdVar4 = INFINITY;
      }
    }
    local_80 = 0x7ff0000000000000;
    std::valarray<double>::operator=(in_stack_fffffffffffffe70,(double *)in_stack_fffffffffffffe68);
    local_54 = in_RDI->num_constr_;
    local_88 = &in_RDI->boxed_vars_;
    local_90._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffffe70,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffffe68), bVar2) {
      piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_90);
      iVar9 = *piVar5;
      sVar7 = (size_t)local_54;
      local_54 = local_54 + 1;
      pdVar4 = std::valarray<double>::operator[](local_30,sVar7);
      dVar6 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](in_stack_00000020,(long)iVar9);
      *pdVar4 = dVar6;
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_90);
    }
    for (local_a0 = 0; local_a0 < in_RDI->num_constr_; local_a0 = local_a0 + 1) {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         (&in_RDI->constr_type_,(long)local_a0);
      cVar1 = *pvVar3;
      if (cVar1 == '<') {
        pdVar4 = std::valarray<double>::operator[](in_stack_00000008,(long)local_a0);
        dVar6 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000028,(long)local_a0);
        *pdVar4 = dVar6;
      }
      else if (cVar1 == '=') {
        pdVar4 = std::valarray<double>::operator[](in_stack_00000028,(long)local_a0);
        *pdVar4 = 0.0;
      }
      else if (cVar1 == '>') {
        pdVar4 = std::valarray<double>::operator[](local_30,(long)local_a0);
        dVar6 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](in_stack_00000028,(long)local_a0);
        *pdVar4 = -dVar6;
      }
    }
  }
  return;
}

Assistant:

void Model::DualizeBackInteriorSolution(const Vector& x_solver,
                                        const Vector& xl_solver,
                                        const Vector& xu_solver,
                                        const Vector& y_solver,
                                        const Vector& zl_solver,
                                        const Vector& zu_solver,
                                        Vector& x_user,
                                        Vector& xl_user,
                                        Vector& xu_user,
                                        Vector& slack_user,
                                        Vector& y_user,
                                        Vector& zl_user,
                                        Vector& zu_user) const {
    const Int m = rows();
    const Int n = cols();

    if (dualized_) {
        assert(num_var_ == m);
        assert(num_constr_ + (Int)boxed_vars_.size() == n);
        x_user = -y_solver;

        // If the solution from the solver would be exact, we could copy the
        // first num_constr_ entries from x_solver into y_user. However, to
        // satisfy the sign condition on y_user even if the solution is not
        // exact, we have to use the xl_solver and xu_solver entries for
        // inequality constraints.
        for (Int i = 0; i < num_constr_; i++) {
            switch (constr_type_[i]) {
            case '=':
                y_user[i] = x_solver[i];
                break;
            case '<':
                y_user[i] = -xu_solver[i];
                break;
            case '>':
                y_user[i] = xl_solver[i];
                break;
            }
            assert(std::isfinite(y_user[i]));
        }

        // Dual variables associated with lbuser <= x in the scaled user model
        // are the slack variables from the solver. For an exact solution we
        // would have x_solver[n+1:n+m] == xl_solver[n+1:n+m]. Using xl_solver
        // guarantees that zl_user >= 0 in any case. If variable j has no lower
        // bound in the scaled user model (i.e. is free), then the j-th slack
        // variable was fixed at zero in the solver model, but the IPM solution
        // may not satisfy this. Hence we must set zl_user[j] = 0 explicitly.
        std::copy_n(std::begin(xl_solver) + n, num_var_, std::begin(zl_user));
        for (Int j = 0; j < num_var_; j++)
            if (!std::isfinite(scaled_lbuser_[j]))
                zl_user[j] = 0.0;

        // Dual variables associated with x <= ubuser in the scaled user model
        // are the primal variables that were added for boxed variables in the
        // solver model.
        zu_user = 0.0;
        Int k = num_constr_;
        for (Int j : boxed_vars_)
            zu_user[j] = xl_solver[k++];
        assert(k == n);

        // xl in the scaled user model is zl[n+1:n+m] in the solver model or
        // infinity.
        for (Int i = 0; i < m; i++) {
            if (std::isfinite(scaled_lbuser_[i]))
                xl_user[i] = zl_solver[n+i];
            else
                xl_user[i] = INFINITY;
        }

        // xu in the scaled user model are the entries in zl for columns of the
        // negative identity matrix (that were added for boxed variables).
        xu_user = INFINITY;
        k = num_constr_;
        for (Int j : boxed_vars_)
            xu_user[j] = zl_solver[k++];
        assert(k == n);
        
        for (Int i = 0; i < num_constr_; i++) {
            switch (constr_type_[i]) {
            case '=':
                slack_user[i] = 0.0;
                break;
            case '<':
                slack_user[i] = zu_solver[i];
                break;
            case '>':
                slack_user[i] = -zl_solver[i];
                break;
            }
        }
    }
    else {
        assert(num_constr_ == m);
        assert(num_var_ == n);
        std::copy_n(std::begin(x_solver), num_var_, std::begin(x_user));

        // Instead of copying y_solver into y_user, we use the entries from
        // zl_solver and zu_solver for inequality constraints, so that the sign
        // condition on y_user is satisfied.
        for (Int i = 0; i < m; i++) {
            assert(lb_[n+i] == 0.0 || lb_[n+i] == -INFINITY);
            assert(ub_[n+i] == 0.0 || ub_[n+i] ==  INFINITY);
            assert(lb_[n+i] == 0.0 || ub_[n+i] == 0.0);
            switch (constr_type_[i]) {
            case '=':
                y_user[i] = y_solver[i];
                break;
            case '<':
                y_user[i] = -zl_solver[n+i];
                break;
            case '>':
                y_user[i] = zu_solver[n+i];
                break;
            }
            assert(std::isfinite(y_user[i]));
        }
        std::copy_n(std::begin(zl_solver), num_var_, std::begin(zl_user));
        std::copy_n(std::begin(zu_solver), num_var_, std::begin(zu_user));
        std::copy_n(std::begin(xl_solver), num_var_, std::begin(xl_user));
        std::copy_n(std::begin(xu_solver), num_var_, std::begin(xu_user));

        // If the solution would be exact, slack_user were given by the entries
        // of x_solver corresponding to slack columns. To satisfy the sign
        // condition in any case, we build the slack for inequality constraints
        // from xl_solver and xu_solver and set the slack for equality
        // constraints to zero.
        for (Int i = 0; i < m; i++) {
            switch (constr_type_[i]) {
            case '=':
                slack_user[i] = 0.0;
                break;
            case '<':
                slack_user[i] = xl_solver[n+i];
                break;
            case '>':
                slack_user[i] = -xu_solver[n+i];
                break;
            }
            assert(std::isfinite(slack_user[i]));
        }
    }
}